

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindings.cpp
# Opt level: O3

void __thiscall
service::service(service *this,shared_ptr<interface1> *sp,bool b,int i,function<int_()> *f,int ni)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  long lVar3;
  element_type *peVar4;
  
  peVar4 = (sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (this->sp).super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar4;
  p_Var1 = (sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (this->sp).super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
      UNLOCK();
      peVar4 = (sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
    }
  }
  if (peVar4 != (element_type *)0x0) {
    lVar3 = __dynamic_cast(peVar4,&interface1::typeinfo,&implementation1_2::typeinfo,0);
    if (lVar3 != 0) {
      if (b) {
        __assert_fail("!b",
                      "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                      ,0x24,
                      "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                     );
      }
      if (i == 0x2a) {
        if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
          std::__throw_bad_function_call();
        }
        else {
          iVar2 = (*f->_M_invoker)((_Any_data *)f);
          if (iVar2 == 0x57) {
            if (ni == 0x7b) {
              return;
            }
            __assert_fail("ni == 123",
                          "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                          ,0x27,
                          "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                         );
          }
        }
        __assert_fail("f() == 87",
                      "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                      ,0x26,
                      "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                     );
      }
      __assert_fail("i == 42",
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                    ,0x25,
                    "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                   );
    }
  }
  __assert_fail("dynamic_cast<implementation1_2*>(sp.get())",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                ,0x23,
                "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
               );
}

Assistant:

int ni)
      : sp(sp) {
    assert(dynamic_cast<implementation1_2*>(sp.get()));  // overridden
    assert(!b);                                          // default initialization
    assert(i == 42);
    assert(f() == 87);
    assert(ni == 123);
  }